

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build.cc
# Opt level: O3

void __thiscall Plan::ScheduleWork(Plan *this,iterator want_e)

{
  Pool *this_00;
  Edge *edge;
  Edge *local_18;
  
  if (*(int *)&want_e._M_node[1]._M_parent == 1) {
    *(undefined4 *)&want_e._M_node[1]._M_parent = 2;
    local_18 = *(Edge **)(want_e._M_node + 1);
    this_00 = local_18->pool_;
    if (this_00->depth_ == 0) {
      Pool::EdgeScheduled(this_00,local_18);
      std::_Rb_tree<Edge*,Edge*,std::_Identity<Edge*>,EdgeCmp,std::allocator<Edge*>>::
      _M_insert_unique<Edge*const&>
                ((_Rb_tree<Edge*,Edge*,std::_Identity<Edge*>,EdgeCmp,std::allocator<Edge*>> *)
                 &this->ready_,&local_18);
    }
    else {
      Pool::DelayEdge(this_00,local_18);
      Pool::RetrieveReadyEdges(this_00,&this->ready_);
    }
  }
  else if (*(int *)&want_e._M_node[1]._M_parent != 2) {
    __assert_fail("want_e->second == kWantToStart",
                  "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build.cc",
                  0xae,"void Plan::ScheduleWork(map<Edge *, Want>::iterator)");
  }
  return;
}

Assistant:

void Plan::ScheduleWork(map<Edge*, Want>::iterator want_e) {
  if (want_e->second == kWantToFinish) {
    // This edge has already been scheduled.  We can get here again if an edge
    // and one of its dependencies share an order-only input, or if a node
    // duplicates an out edge (see https://github.com/ninja-build/ninja/pull/519).
    // Avoid scheduling the work again.
    return;
  }
  assert(want_e->second == kWantToStart);
  want_e->second = kWantToFinish;

  Edge* edge = want_e->first;
  Pool* pool = edge->pool();
  if (pool->ShouldDelayEdge()) {
    pool->DelayEdge(edge);
    pool->RetrieveReadyEdges(&ready_);
  } else {
    pool->EdgeScheduled(*edge);
    ready_.insert(edge);
  }
}